

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_par.cc
# Opt level: O3

char * ASN1_tag2str(int tag)

{
  uint uVar1;
  
  uVar1 = tag & 10;
  if ((tag & 0xfffffff7U) != 0x102) {
    uVar1 = tag;
  }
  if (0x1e < uVar1) {
    return "(unknown)";
  }
  return _ZZ12ASN1_tag2strE7tag2str_rel +
         *(int *)(_ZZ12ASN1_tag2strE7tag2str_rel + (ulong)uVar1 * 4);
}

Assistant:

const char *ASN1_tag2str(int tag) {
  static const char *const tag2str[] = {
      "EOC",
      "BOOLEAN",
      "INTEGER",
      "BIT STRING",
      "OCTET STRING",
      "NULL",
      "OBJECT",
      "OBJECT DESCRIPTOR",
      "EXTERNAL",
      "REAL",
      "ENUMERATED",
      "<ASN1 11>",
      "UTF8STRING",
      "<ASN1 13>",
      "<ASN1 14>",
      "<ASN1 15>",
      "SEQUENCE",
      "SET",
      "NUMERICSTRING",
      "PRINTABLESTRING",
      "T61STRING",
      "VIDEOTEXSTRING",
      "IA5STRING",
      "UTCTIME",
      "GENERALIZEDTIME",
      "GRAPHICSTRING",
      "VISIBLESTRING",
      "GENERALSTRING",
      "UNIVERSALSTRING",
      "<ASN1 29>",
      "BMPSTRING",
  };

  if ((tag == V_ASN1_NEG_INTEGER) || (tag == V_ASN1_NEG_ENUMERATED)) {
    tag &= ~V_ASN1_NEG;
  }

  if (tag < 0 || tag > 30) {
    return "(unknown)";
  }
  return tag2str[tag];
}